

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxConversion.h
# Opt level: O3

String * __thiscall
Jinx::Impl::UnsignedIntegerToString_abi_cxx11_
          (String *__return_storage_ptr__,Impl *this,uint64_t value)

{
  size_t sVar1;
  char buffer [32];
  char acStack_38 [40];
  
  snprintf(acStack_38,0x20,"%lu",this);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(acStack_38);
  std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>::
  _M_construct<char_const*>
            ((basic_string<char,std::char_traits<char>,Jinx::Allocator<char>> *)
             __return_storage_ptr__,acStack_38,acStack_38 + sVar1);
  return __return_storage_ptr__;
}

Assistant:

inline String UnsignedIntegerToString(uint64_t value)
	{
		char buffer[32];
		snprintf(buffer, 32, "%" PRIu64, value);
		return String(buffer);
	}